

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_core_module.c
# Opt level: O1

ngx_int_t ngx_stream_core_content_phase(ngx_stream_session_t *s,ngx_stream_phase_handler_t *ph)

{
  ngx_connection_t *c;
  ngx_log_t *log;
  undefined8 *puVar1;
  int iVar2;
  undefined8 in_RAX;
  int *piVar3;
  undefined8 uStack_28;
  int tcp_nodelay;
  
  c = s->connection;
  log = c->log;
  log->action = (char *)0x0;
  puVar1 = (undefined8 *)s->srv_conf[ngx_stream_core_module.ctx_index];
  uStack_28 = in_RAX;
  if (((c->type == 1) && (puVar1[4] != 0)) && ((c->field_0xda & 0x30) == 0)) {
    if ((log->log_level & 0x400) != 0) {
      ngx_log_error_core(8,log,0,"tcp_nodelay");
    }
    uStack_28 = CONCAT44(1,(undefined4)uStack_28);
    iVar2 = setsockopt(c->fd,6,1,(void *)((long)&uStack_28 + 4),4);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      ngx_connection_error(c,*piVar3,"setsockopt(TCP_NODELAY) failed");
      ngx_stream_finalize_session(s,500);
      return 0;
    }
    *(uint *)&c->field_0xd8 = *(uint *)&c->field_0xd8 & 0xffcfffff | 0x100000;
  }
  (*(code *)*puVar1)(s);
  return 0;
}

Assistant:

ngx_int_t
ngx_stream_core_content_phase(ngx_stream_session_t *s,
    ngx_stream_phase_handler_t *ph)
{
    int                          tcp_nodelay;
    ngx_connection_t            *c;
    ngx_stream_core_srv_conf_t  *cscf;

    c = s->connection;

    c->log->action = NULL;

    cscf = ngx_stream_get_module_srv_conf(s, ngx_stream_core_module);

    if (c->type == SOCK_STREAM
        && cscf->tcp_nodelay
        && c->tcp_nodelay == NGX_TCP_NODELAY_UNSET)
    {
        ngx_log_debug0(NGX_LOG_DEBUG_STREAM, c->log, 0, "tcp_nodelay");

        tcp_nodelay = 1;

        if (setsockopt(c->fd, IPPROTO_TCP, TCP_NODELAY,
                       (const void *) &tcp_nodelay, sizeof(int)) == -1)
        {
            ngx_connection_error(c, ngx_socket_errno,
                                 "setsockopt(TCP_NODELAY) failed");
            ngx_stream_finalize_session(s, NGX_STREAM_INTERNAL_SERVER_ERROR);
            return NGX_OK;
        }

        c->tcp_nodelay = NGX_TCP_NODELAY_SET;
    }

    cscf->handler(s);

    return NGX_OK;
}